

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QCursor __thiscall QGraphicsItem::cursor(QGraphicsItem *this)

{
  Private *pPVar1;
  bool bVar2;
  QCursorData *__old_val;
  long lVar3;
  QMetaType QVar4;
  undefined8 uVar5;
  long in_RSI;
  QVariant *pQVar6;
  QCursorData *pQVar7;
  anon_union_24_3_e3d07ef4_for_data *paVar8;
  long in_FS_OFFSET;
  QMetaType local_48;
  QMetaType local_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  ulong local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)(*(long *)(in_RSI + 8) + 0x18);
  if (lVar3 != 0) {
    pPVar1 = *(Private **)(*(long *)(in_RSI + 8) + 0x10);
    do {
      pQVar6 = (QVariant *)((long)&pPVar1->data + 8);
      if (*(int *)&pQVar6[-1].d.field_0x18 == 1) {
        ::QVariant::QVariant((QVariant *)&local_38,pQVar6);
        local_48.d_ptr = (QMetaTypeInterface *)(local_20 & 0xfffffffffffffffc);
        goto LAB_005db24f;
      }
      pPVar1 = &pQVar6[1].d;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  local_38.shared = (PrivateShared *)0x0;
  local_38._8_8_ = 0;
  local_38._16_8_ = 0;
  local_20 = 2;
  local_48.d_ptr = (QMetaTypeInterface *)0x0;
LAB_005db24f:
  local_40.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QCursor>::metaType;
  bVar2 = comparesEqual(&local_48,&local_40);
  uVar5 = local_38.shared;
  if (bVar2) {
    if ((local_20 & 1) == 0) {
      local_38.shared = (PrivateShared *)0x0;
    }
    else {
      pQVar7 = (QCursorData *)(local_38.shared + *(int *)(local_38.shared + 4));
      if (*(int *)local_38.shared != 1) {
        QCursor::QCursor((QCursor *)this,(QCursor *)pQVar7);
        goto LAB_005db2f3;
      }
      uVar5 = *(undefined8 *)pQVar7;
      *(undefined8 *)pQVar7 = 0;
    }
    this->_vptr_QGraphicsItem = (_func_int **)uVar5;
  }
  else {
    this->_vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    QCursor::QCursor((QCursor *)this);
    paVar8 = &local_38;
    QVar4.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((local_20 & 1) != 0) {
      paVar8 = (anon_union_24_3_e3d07ef4_for_data *)
               (local_38.shared + *(int *)(local_38.shared + 4));
    }
    QMetaType::convert(QVar4,paVar8,local_40,this);
  }
LAB_005db2f3:
  ::QVariant::~QVariant((QVariant *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QCursor)(QCursorData *)this;
  }
  __stack_chk_fail();
}

Assistant:

QCursor QGraphicsItem::cursor() const
{
    return qvariant_cast<QCursor>(d_ptr->extra(QGraphicsItemPrivate::ExtraCursor));
}